

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall
Assimp::BaseImporter::GetExtensionList
          (BaseImporter *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  char cVar1;
  char *pcVar2;
  aiImporterDesc *this_00;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  allocator local_51;
  value_type local_50;
  char *local_30;
  char *last;
  char *ext;
  aiImporterDesc *desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extensions_local;
  BaseImporter *this_local;
  
  desc = (aiImporterDesc *)extensions;
  extensions_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  iVar3 = (*this->_vptr_BaseImporter[5])();
  ext = (char *)CONCAT44(extraout_var,iVar3);
  if (ext == (char *)0x0) {
    __assert_fail("desc != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0x90,"void Assimp::BaseImporter::GetExtensionList(std::set<std::string> &)");
  }
  local_30 = *(char **)(ext + 0x38);
  last = local_30;
  if (local_30 == (char *)0x0) {
    __assert_fail("ext != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0x93,"void Assimp::BaseImporter::GetExtensionList(std::set<std::string> &)");
  }
  do {
    this_00 = desc;
    pcVar2 = local_30;
    if ((*last == '\0') || (*last == ' ')) {
      uVar4 = (long)last - (long)local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,pcVar2,uVar4,&local_51);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if ((long)last - (long)local_30 < 1) {
        __assert_fail("ext-last > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                      ,0x99,"void Assimp::BaseImporter::GetExtensionList(std::set<std::string> &)");
      }
      for (local_30 = last; *local_30 == ' '; local_30 = local_30 + 1) {
      }
    }
    cVar1 = *last;
    last = last + 1;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void BaseImporter::GetExtensionList(std::set<std::string>& extensions) {
    const aiImporterDesc* desc = GetInfo();
    ai_assert(desc != nullptr);

    const char* ext = desc->mFileExtensions;
    ai_assert(ext != nullptr );

    const char* last = ext;
    do {
        if (!*ext || *ext == ' ') {
            extensions.insert(std::string(last,ext-last));
            ai_assert(ext-last > 0);
            last = ext;
            while(*last == ' ') {
                ++last;
            }
        }
    }
    while(*ext++);
}